

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_add_text
               (nk_draw_list *list,nk_user_font *font,nk_rect rect,char *text,int len,
               float font_height,nk_color fg)

{
  nk_handle texture;
  nk_vec2 uvc;
  nk_vec2 uva;
  nk_vec2 c;
  nk_vec2 a;
  float fVar1;
  float fVar2;
  int in_ECX;
  long in_RDX;
  nk_rune *in_RSI;
  float *in_RDI;
  float x_00;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  float char_width;
  float gw;
  float gh;
  float gy;
  float gx;
  nk_user_font_glyph g;
  int next_glyph_len;
  int glyph_len;
  nk_rune next;
  nk_rune unicode;
  int text_len;
  float x;
  nk_draw_list *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  float fVar3;
  code *in_stack_ffffffffffffff48;
  nk_rune *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 local_74 [12];
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float local_60;
  nk_color in_stack_ffffffffffffffa4;
  nk_color color;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  fVar7 = 0.0;
  fVar6 = 0.0;
  fVar5 = 0.0;
  if (((in_RDI != (float *)0x0) && (in_ECX != 0)) && (in_RDX != 0)) {
    local_10 = (float)in_XMM0_Qa;
    local_8 = (float)in_XMM1_Qa;
    if ((*in_RDI < local_10 + local_8) && (local_10 < *in_RDI + in_RDI[2])) {
      fStack_c = (float)((ulong)in_XMM0_Qa >> 0x20);
      fStack_4 = (float)((ulong)in_XMM1_Qa >> 0x20);
      if ((in_RDI[1] < fStack_c + fStack_4) && (fStack_c < in_RDI[1] + in_RDI[3])) {
        texture._4_4_ = in_stack_ffffffffffffff44;
        texture.id = in_stack_ffffffffffffff40;
        nk_draw_list_push_image(in_stack_ffffffffffffff38,texture);
        fVar1 = (float)nk_utf_decode((char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                      in_stack_ffffffffffffff58),
                                     in_stack_ffffffffffffff50,
                                     (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        if (fVar1 != 0.0) {
          while (((int)fVar7 < in_ECX && fVar1 != 0.0 && (fVar6 != 9.18313e-41))) {
            fVar2 = (float)nk_utf_decode((char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                          in_stack_ffffffffffffff58),
                                         in_stack_ffffffffffffff50,
                                         (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            in_stack_ffffffffffffff48 = *(code **)(in_RSI + 6);
            fVar3 = fVar5;
            if (fVar5 == 9.18313e-41) {
              fVar3 = 0.0;
            }
            in_stack_ffffffffffffff50 = in_RSI;
            in_stack_ffffffffffffff5c = in_XMM2_Da;
            (*in_stack_ffffffffffffff48)(in_XMM2_Da,*(undefined8 *)in_RSI,local_74,fVar6,fVar3);
            x_00 = local_10 + in_stack_ffffffffffffff9c;
            color = in_stack_ffffffffffffffa4;
            fVar3 = in_stack_ffffffffffffffa8;
            fVar4 = in_stack_ffffffffffffffac;
            nk_vec2(x_00,fStack_c + local_60);
            nk_vec2(x_00 + (float)in_stack_ffffffffffffffa4,
                    fStack_c + local_60 + in_stack_ffffffffffffffa8);
            a.y = local_10;
            a.x = fVar7;
            c.y = fVar6;
            c.x = fVar5;
            uva.y = fVar1;
            uva.x = fVar2;
            uvc.y = fVar4;
            uvc.x = fVar3;
            nk_draw_list_push_rect_uv
                      ((nk_draw_list *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                       ,a,c,uva,uvc,color);
            fVar7 = (float)((int)fVar1 + (int)fVar7);
            local_10 = in_stack_ffffffffffffffac + local_10;
            in_stack_ffffffffffffffa4 = color;
            in_stack_ffffffffffffffa8 = fVar3;
            in_stack_ffffffffffffffac = fVar4;
            fVar1 = fVar2;
            fVar6 = fVar5;
          }
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_add_text(struct nk_draw_list *list, const struct nk_user_font *font,
struct nk_rect rect, const char *text, int len, float font_height,
struct nk_color fg)
{
float x = 0;
int text_len = 0;
nk_rune unicode = 0;
nk_rune next = 0;
int glyph_len = 0;
int next_glyph_len = 0;
struct nk_user_font_glyph g;

NK_ASSERT(list);
if (!list || !len || !text) return;
if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
list->clip_rect.x, list->clip_rect.y, list->clip_rect.w, list->clip_rect.h)) return;

nk_draw_list_push_image(list, font->texture);
x = rect.x;
glyph_len = nk_utf_decode(text, &unicode, len);
if (!glyph_len) return;

/* draw every glyph image */
fg.a = (nk_byte)((float)fg.a * list->config.global_alpha);
while (text_len < len && glyph_len) {
float gx, gy, gh, gw;
float char_width = 0;
if (unicode == NK_UTF_INVALID) break;

/* query currently drawn glyph information */
next_glyph_len = nk_utf_decode(text + text_len + glyph_len, &next, (int)len - text_len);
font->query(font->userdata, font_height, &g, unicode,
(next == NK_UTF_INVALID) ? '\0' : next);

/* calculate and draw glyph drawing rectangle and image */
gx = x + g.offset.x;
gy = rect.y + g.offset.y;
gw = g.width; gh = g.height;
char_width = g.xadvance;
nk_draw_list_push_rect_uv(list, nk_vec2(gx,gy), nk_vec2(gx + gw, gy+ gh),
g.uv[0], g.uv[1], fg);

/* offset next glyph */
text_len += glyph_len;
x += char_width;
glyph_len = next_glyph_len;
unicode = next;
}
}